

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

rnnbitfield * parsebitfield(rnndb *db,char *file,xmlNode *node)

{
  int iVar1;
  char *pcVar2;
  uint64_t uVar3;
  rnndb *in_RDX;
  char *in_RSI;
  long in_RDI;
  xmlNode *chain;
  int lowok;
  int highok;
  xmlAttr *attr;
  rnnbitfield *bf;
  rnntypeinfo *in_stack_ffffffffffffffb8;
  xmlAttr *in_stack_ffffffffffffffc0;
  rnntypeinfo *ti;
  int iVar4;
  int line;
  char *pcVar5;
  rnnbitfield *local_8;
  
  local_8 = (rnnbitfield *)calloc(0xe0,1);
  local_8->file = in_RSI;
  line = 0;
  iVar4 = 0;
  for (pcVar5 = *(char **)&in_RDX->groupsnum; pcVar5 != (char *)0x0;
      pcVar5 = *(char **)(pcVar5 + 0x30)) {
    iVar1 = strcmp(*(char **)(pcVar5 + 0x10),"name");
    if (iVar1 == 0) {
      pcVar2 = getattrib((rnndb *)local_8,pcVar5,line,in_stack_ffffffffffffffc0);
      pcVar2 = strdup(pcVar2);
      local_8->name = pcVar2;
    }
    else {
      iVar1 = strcmp(*(char **)(pcVar5 + 0x10),"high");
      if (iVar1 == 0) {
        uVar3 = getnumattrib(in_RDX,(char *)local_8,(int)((ulong)pcVar5 >> 0x20),
                             (xmlAttr *)CONCAT44(line,iVar4));
        local_8->high = (int)uVar3;
        line = 1;
      }
      else {
        iVar1 = strcmp(*(char **)(pcVar5 + 0x10),"low");
        if (iVar1 == 0) {
          uVar3 = getnumattrib(in_RDX,(char *)local_8,(int)((ulong)pcVar5 >> 0x20),
                               (xmlAttr *)CONCAT44(line,iVar4));
          local_8->low = (int)uVar3;
          iVar4 = 1;
        }
        else {
          iVar1 = strcmp(*(char **)(pcVar5 + 0x10),"pos");
          if (iVar1 == 0) {
            uVar3 = getnumattrib(in_RDX,(char *)local_8,(int)((ulong)pcVar5 >> 0x20),
                                 (xmlAttr *)CONCAT44(line,iVar4));
            local_8->low = (int)uVar3;
            local_8->high = (int)uVar3;
            line = 1;
            iVar4 = 1;
          }
          else {
            iVar1 = strcmp(*(char **)(pcVar5 + 0x10),"varset");
            if (iVar1 == 0) {
              pcVar2 = getattrib((rnndb *)local_8,pcVar5,line,in_stack_ffffffffffffffc0);
              pcVar2 = strdup(pcVar2);
              (local_8->varinfo).varsetstr = pcVar2;
            }
            else {
              iVar1 = strcmp(*(char **)(pcVar5 + 0x10),"variants");
              if (iVar1 == 0) {
                pcVar2 = getattrib((rnndb *)local_8,pcVar5,line,in_stack_ffffffffffffffc0);
                pcVar2 = strdup(pcVar2);
                (local_8->varinfo).variantsstr = pcVar2;
              }
              else {
                iVar1 = trytypeattr((rnndb *)local_8,pcVar5,(xmlNode *)CONCAT44(line,iVar4),
                                    in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
                if (iVar1 == 0) {
                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for bitfield\n",in_RSI,
                          (ulong)*(ushort *)&in_RDX->files,*(undefined8 *)(pcVar5 + 0x10));
                  *(undefined4 *)(in_RDI + 0x80) = 1;
                }
              }
            }
          }
        }
      }
    }
  }
  pcVar5 = (char *)0x0;
  for (ti = *(rnntypeinfo **)&(in_RDX->copyright).authorsnum; ti != (rnntypeinfo *)0x0;
      ti = *(rnntypeinfo **)&ti->bitfieldsnum) {
    if ((((ti->type == RNN_TTYPE_INLINE_BITSET) &&
         (iVar1 = trytypetag((rnndb *)local_8,pcVar5,(xmlNode *)CONCAT44(line,iVar4),ti), iVar1 == 0
         )) && (iVar1 = trytop((rnndb *)local_8,pcVar5,(xmlNode *)CONCAT44(line,iVar4)), iVar1 == 0)
        ) && (iVar1 = trydoc((rnndb *)CONCAT44(line,iVar4),(char *)ti,
                             (xmlNode *)in_stack_ffffffffffffffb8), iVar1 == 0)) {
      fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",in_RSI,(ulong)(ushort)ti->alignvalid,
              (in_RDX->copyright).authors,ti->eenum);
      *(undefined4 *)(in_RDI + 0x80) = 1;
    }
  }
  if (local_8->name == (char *)0x0) {
    fprintf(_stderr,"%s:%d: nameless bitfield\n",in_RSI,(ulong)*(ushort *)&in_RDX->files);
    *(undefined4 *)(in_RDI + 0x80) = 1;
    local_8 = (rnnbitfield *)0x0;
  }
  else if (((line == 0) || (iVar4 == 0)) || (local_8->high < local_8->low)) {
    fprintf(_stderr,"%s:%d: bitfield has wrong placement\n",in_RSI,(ulong)*(ushort *)&in_RDX->files)
    ;
    *(undefined4 *)(in_RDI + 0x80) = 1;
    local_8 = (rnnbitfield *)0x0;
  }
  return local_8;
}

Assistant:

static struct rnnbitfield *parsebitfield(struct rnndb *db, char *file, xmlNode *node) {
	struct rnnbitfield *bf = calloc(sizeof *bf, 1);
	bf->file = file;
	xmlAttr *attr = node->properties;
	int highok = 0, lowok = 0;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			bf->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "high")) {
			bf->high = getnumattrib(db, file, node->line, attr);
			highok = 1;
		} else if (!strcmp(attr->name, "low")) {
			bf->low = getnumattrib(db, file, node->line, attr);
			lowok = 1;
		} else if (!strcmp(attr->name, "pos")) {
			bf->high = bf->low = getnumattrib(db, file, node->line, attr);
			lowok = highok = 1;
		} else if (!strcmp(attr->name, "varset")) {
			bf->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			bf->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!trytypeattr(db, file, node, attr, &bf->typeinfo)) {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for bitfield\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytypetag(db, file, chain, &bf->typeinfo) && !trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!bf->name) {
		fprintf (stderr, "%s:%d: nameless bitfield\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else if (!highok || !lowok || bf->high < bf->low) {
		fprintf (stderr, "%s:%d: bitfield has wrong placement\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
		return bf;
	}
}